

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void Imf_3_2::anon_unknown_0::readSampleCountForLineBlock
               (InputStreamMutex *streamData,Data *data,int lineBlockId,
               Array2D<unsigned_int> *sampleCountBuffer,int sampleCountMinY,bool writeToSlice)

{
  int iVar1;
  Compressor *pCVar2;
  char *pcVar3;
  uint *puVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ostream *poVar11;
  ArgExc *pAVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  char *readPtr;
  char b [4];
  char *local_1c8;
  long local_1c0;
  int local_1b8;
  undefined4 uStack_1b4;
  ostream local_1a8 [376];
  
  (*streamData->is->_vptr_IStream[6])
            (streamData->is,
             (data->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[lineBlockId]);
  if ((data->version & 0x1000) != 0) {
    (*streamData->is->_vptr_IStream[3])(streamData->is,&local_1b8,4);
    if (local_1b8 != data->partNumber) {
      pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar12,"Unexpected part number.");
      goto LAB_00163b70;
    }
  }
  (*streamData->is->_vptr_IStream[3])(streamData->is,&local_1b8,4);
  iVar1 = local_1b8;
  lVar15 = (long)local_1b8;
  if (local_1b8 == data->linesInBuffer * lineBlockId + data->minY) {
    iVar13 = local_1b8 + data->linesInBuffer + -1;
    if (data->maxY < iVar13) {
      iVar13 = data->maxY;
    }
    (*streamData->is->_vptr_IStream[3])(streamData->is,&local_1b8,8);
    iVar14 = local_1b8;
    uVar10 = CONCAT44(uStack_1b4,local_1b8);
    if ((ulong)(long)data->maxSampleCountTableSize < uVar10) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Bad sampleCountTableDataSize read from chunk ",0x2d);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,": expected ",0xb);
      poVar11 = (ostream *)
                std::ostream::operator<<((ostream *)poVar11,data->maxSampleCountTableSize);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," or less, got ",0xe);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&local_1b8);
      __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    (*streamData->is->_vptr_IStream[3])(streamData->is,&local_1b8,8);
    uVar6 = CONCAT44(uStack_1b4,local_1b8);
    (*streamData->is->_vptr_IStream[3])(streamData->is,&local_1b8,8);
    uVar7 = CONCAT44(uStack_1b4,local_1b8);
    if ((0x7fffffff < uVar6) || ((uVar7 | uVar10) >> 0x1f != 0)) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"This version of the library does not",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"support the allocation of data with size  > ",0x2c);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," file table size    :",0x15);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," file unpacked size :",0x15);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," file packed size   :",0x15);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
      pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&local_1b8);
      __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    (*streamData->is->_vptr_IStream[3])(streamData->is,(data->sampleCountTableBuffer)._data,iVar14);
    if (uVar10 < (ulong)(long)data->maxSampleCountTableSize) {
      pCVar2 = data->sampleCountTableComp;
      if (pCVar2 == (Compressor *)0x0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Deep scanline data corrupt at chunk ",0x24);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," (sampleCountTableDataSize error)",0x21);
        pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&local_1b8);
        __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      (*pCVar2->_vptr_Compressor[6])
                (pCVar2,(data->sampleCountTableBuffer)._data,iVar14,lVar15,&local_1c8);
    }
    else {
      local_1c8 = (data->sampleCountTableBuffer)._data;
    }
    if (iVar1 <= iVar13) {
      pcVar3 = data->sampleCountSliceBase;
      local_1c0 = (long)data->sampleCountYStride;
      iVar1 = data->sampleCountXStride;
      puVar4 = (data->lineSampleCount)._data;
      uVar10 = (ulong)(uint)data->minY;
      lVar19 = 0;
      pcVar17 = local_1c8;
      do {
        lVar18 = lVar15 - (int)uVar10;
        puVar4[lVar18] = 0;
        if (data->maxX < data->minX) {
          uVar10 = 0;
        }
        else {
          lVar20 = (long)data->minX;
          iVar14 = 0;
          do {
            lVar9 = 0;
            pcVar16 = pcVar17;
            do {
              pcVar17 = pcVar16 + 1;
              *(char *)((long)&local_1b8 + lVar9) = *pcVar16;
              lVar9 = lVar9 + 1;
              pcVar16 = pcVar17;
            } while ((int)lVar9 != 4);
            uVar8 = local_1b8 - iVar14;
            local_1c8 = pcVar17;
            if (local_1b8 < iVar14) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,"Deep scanline sampleCount data corrupt at chunk ",0x30);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11," (negative sample count detected)",0x21);
              pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&local_1b8);
              __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            if (sampleCountBuffer != (Array2D<unsigned_int> *)0x0) {
              sampleCountBuffer->_data
              [sampleCountBuffer->_sizeY * (lVar15 - sampleCountMinY) + (lVar20 - data->minX)] =
                   uVar8;
            }
            puVar4[lVar18] = puVar4[lVar18] + uVar8;
            if (writeToSlice) {
              *(uint *)(pcVar3 + lVar20 * iVar1 + lVar15 * local_1c0) = uVar8;
            }
            bVar5 = lVar20 < data->maxX;
            lVar20 = lVar20 + 1;
            iVar14 = local_1b8;
          } while (bVar5);
          uVar10 = (ulong)puVar4[lVar18];
        }
        lVar19 = lVar19 + uVar10;
        uVar10 = data->combinedSampleSize * lVar19;
        if (uVar7 <= uVar10 && uVar10 - uVar7 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Deep scanline sampleCount data corrupt at chunk ",0x30);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lineBlockId);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,": pixel data only contains ",0x1b);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," bytes of data but table references at least ",0x2d);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," bytes of sample data",0x15);
          pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar12,(stringstream *)&local_1b8);
          __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        uVar10 = (ulong)data->minY;
        (data->gotSampleCount)._data[lVar15 - uVar10] = true;
        lVar15 = lVar15 + 1;
      } while (iVar13 + 1 != (int)lVar15);
    }
    return;
  }
  pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar12,"Unexpected data block y coordinate.");
LAB_00163b70:
  __cxa_throw(pAVar12,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
readSampleCountForLineBlock (
    InputStreamMutex*            streamData,
    DeepScanLineInputFile::Data* data,
    int                          lineBlockId,
    Array2D<unsigned int>*       sampleCountBuffer,
    int                          sampleCountMinY,
    bool                         writeToSlice)
{
    streamData->is->seekg (data->lineOffsets[lineBlockId]);

    if (isMultiPart (data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            *streamData->is, partNumber);

        if (partNumber != data->partNumber)
            throw IEX_NAMESPACE::ArgExc ("Unexpected part number.");
    }

    int minY;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, minY);

    //
    // Check the correctness of minY.
    //

    if (minY != data->minY + lineBlockId * data->linesInBuffer)
        throw IEX_NAMESPACE::ArgExc ("Unexpected data block y coordinate.");

    int maxY;
    maxY = min (minY + data->linesInBuffer - 1, data->maxY);

    uint64_t sampleCountTableDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, sampleCountTableDataSize);

    if (sampleCountTableDataSize >
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Bad sampleCountTableDataSize read from chunk "
                << lineBlockId << ": expected " << data->maxSampleCountTableSize
                << " or less, got " << sampleCountTableDataSize);
    }

    uint64_t packedDataSize;
    uint64_t unpackedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, packedDataSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, unpackedDataSize);

    //
    // We make a check on the data size requirements here.
    // Whilst we wish to store 64bit sizes on disk, not all the compressors
    // have been made to work with such data sizes and are still limited to
    // using signed 32 bit (int) for the data size. As such, this version
    // insists that we validate that the data size does not exceed the data
    // type max limit.
    // @TODO refactor the compressor code to ensure full 64-bit support.
    //

    uint64_t compressorMaxDataSize =
        static_cast<uint64_t> (std::numeric_limits<int>::max ());
    if (packedDataSize > compressorMaxDataSize ||
        unpackedDataSize > compressorMaxDataSize ||
        sampleCountTableDataSize > compressorMaxDataSize)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "This version of the library does not"
                << "support the allocation of data with size  > "
                << compressorMaxDataSize
                << " file table size    :" << sampleCountTableDataSize
                << " file unpacked size :" << unpackedDataSize
                << " file packed size   :" << packedDataSize << ".\n");
    }

    streamData->is->read (
        data->sampleCountTableBuffer,
        static_cast<int> (sampleCountTableDataSize));

    const char* readPtr;

    //
    // If the sample count table is compressed, we'll uncompress it.
    //

    if (sampleCountTableDataSize <
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        if (!data->sampleCountTableComp)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline data corrupt at chunk "
                    << lineBlockId << " (sampleCountTableDataSize error)");
        }
        data->sampleCountTableComp->uncompress (
            data->sampleCountTableBuffer,
            static_cast<int> (sampleCountTableDataSize),
            minY,
            readPtr);
    }
    else
        readPtr = data->sampleCountTableBuffer;

    char* base    = data->sampleCountSliceBase;
    int   xStride = data->sampleCountXStride;
    int   yStride = data->sampleCountYStride;

    // total number of samples in block: used to check samplecount table doesn't
    // reference more data than exists

    size_t cumulative_total_samples = 0;

    for (int y = minY; y <= maxY; y++)
    {
        int yInDataWindow                    = y - data->minY;
        data->lineSampleCount[yInDataWindow] = 0;

        int lastAccumulatedCount = 0;
        for (int x = data->minX; x <= data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read<CharPtrIO> (readPtr, accumulatedCount);

            // sample count table should always contain monotonically
            // increasing values.
            if (accumulatedCount < lastAccumulatedCount)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Deep scanline sampleCount data corrupt at chunk "
                        << lineBlockId << " (negative sample count detected)");
            }

            count                = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in internal data structure.
            //

            if (sampleCountBuffer)
            {
                (*sampleCountBuffer)[y - sampleCountMinY][x - data->minX] =
                    count;
            }
            data->lineSampleCount[yInDataWindow] += count;

            //
            // Store the data in external slice
            //
            if (writeToSlice)
            {
                sampleCount (base, xStride, yStride, x, y) = count;
            }
        }
        cumulative_total_samples += data->lineSampleCount[yInDataWindow];
        if (cumulative_total_samples * data->combinedSampleSize >
            unpackedDataSize)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline sampleCount data corrupt at chunk "
                    << lineBlockId << ": pixel data only contains "
                    << unpackedDataSize
                    << " bytes of data but table references at least "
                    << cumulative_total_samples * data->combinedSampleSize
                    << " bytes of sample data");
        }

        data->gotSampleCount[y - data->minY] = true;
    }
}